

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O3

void __thiscall Corrade::Utility::Arguments::Arguments(Arguments *this,Arguments *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->_flags)._value = (other->_flags)._value;
  this->_finalOptionalArgument = 0;
  this->_arrayArgument = 0;
  paVar1 = &(this->_prefix).field_2;
  (this->_prefix)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (other->_prefix)._M_dataplus._M_p;
  paVar2 = &(other->_prefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(other->_prefix).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_prefix).field_2 + 8) = uVar4;
  }
  else {
    (this->_prefix)._M_dataplus._M_p = pcVar3;
    (this->_prefix).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_prefix)._M_string_length = (other->_prefix)._M_string_length;
  (other->_prefix)._M_dataplus._M_p = (pointer)paVar2;
  (other->_prefix)._M_string_length = 0;
  (other->_prefix).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->_command).field_2;
  (this->_command)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (other->_command)._M_dataplus._M_p;
  paVar2 = &(other->_command).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(other->_command).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_command).field_2 + 8) = uVar4;
  }
  else {
    (this->_command)._M_dataplus._M_p = pcVar3;
    (this->_command).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_command)._M_string_length = (other->_command)._M_string_length;
  (other->_command)._M_dataplus._M_p = (pointer)paVar2;
  (other->_command)._M_string_length = 0;
  (other->_command).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->_help).field_2;
  (this->_help)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (other->_help)._M_dataplus._M_p;
  paVar2 = &(other->_help).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(other->_help).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_help).field_2 + 8) = uVar4;
  }
  else {
    (this->_help)._M_dataplus._M_p = pcVar3;
    (this->_help).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_help)._M_string_length = (other->_help)._M_string_length;
  (other->_help)._M_dataplus._M_p = (pointer)paVar2;
  (other->_help)._M_string_length = 0;
  (other->_help).field_2._M_local_buf[0] = '\0';
  (this->_entries)._data = (other->_entries)._data;
  (this->_entries)._size = (other->_entries)._size;
  (this->_entries)._deleter = (other->_entries)._deleter;
  (other->_entries)._deleter = (_func_void_Entry_ptr_unsigned_long *)0x0;
  (other->_entries)._data = (Entry *)0x0;
  (other->_entries)._size = 0;
  (this->_values)._data = (other->_values)._data;
  (this->_values)._size = (other->_values)._size;
  (this->_values)._deleter = (other->_values)._deleter;
  (other->_values)._deleter =
       (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_unsigned_long
        *)0x0;
  (other->_values)._data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (other->_values)._size = 0;
  (this->_arrayValues)._deleter =
       (_func_void_Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ptr)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr,_unsigned_long)>_ptr_unsigned_long
        *)0x0;
  (this->_arrayValues)._data =
       (Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
        *)0x0;
  (this->_arrayValues)._size = 0;
  (this->_skippedPrefixes)._data = (other->_skippedPrefixes)._data;
  (this->_skippedPrefixes)._size = (other->_skippedPrefixes)._size;
  (this->_skippedPrefixes)._deleter = (other->_skippedPrefixes)._deleter;
  (other->_skippedPrefixes)._deleter =
       (_func_void_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_ptr_unsigned_long
        *)0x0;
  (other->_skippedPrefixes)._data =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  (other->_skippedPrefixes)._size = 0;
  (this->_booleans)._data = (other->_booleans)._data;
  (this->_booleans)._size = (other->_booleans)._size;
  (this->_booleans)._deleter = (other->_booleans)._deleter;
  (other->_booleans)._deleter = (_func_void_bool_ptr_unsigned_long *)0x0;
  (other->_booleans)._data = (bool *)0x0;
  (other->_booleans)._size = 0;
  this->_parseErrorCallback = other->_parseErrorCallback;
  this->_parseErrorCallbackState = other->_parseErrorCallbackState;
  (other->_flags)._value = (other->_flags)._value & 0x7f;
  return;
}

Assistant:

Arguments::Arguments(Arguments&& other) noexcept: _flags{std::move(other._flags)}, _prefix{std::move(other._prefix)}, _command{std::move(other._command)}, _help{std::move(other._help)}, _entries{std::move(other._entries)}, _values{std::move(other._values)}, _skippedPrefixes{std::move(other._skippedPrefixes)}, _booleans{std::move(other._booleans)}, _parseErrorCallback{std::move(other._parseErrorCallback)}, _parseErrorCallbackState{std::move(other._parseErrorCallbackState)} {
    other._flags &= ~InternalFlag::Parsed;
}